

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

ExprPtr __thiscall mathiu::impl::substitute(impl *this,ExprPtr *ex,ExprPtr *srcDstPairs)

{
  element_type *peVar1;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *p_Var2;
  impl *piVar3;
  bool bVar4;
  long lVar5;
  variant_alternative_t<1UL,_variant<monostate,_const_Set_*,_const_Pair_*,_bool>_> *value;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>_&>
  pIVar6;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>_&>
  pSVar7;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  *ppVar8;
  iterator iVar9;
  const_iterator __position;
  _Base_ptr p_Var10;
  variant_alternative_t<2UL,_variant<monostate,_const_Set_*,_const_Pair_*,_bool>_> *value_00;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>_&>
  pIVar11;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>_&>
  __a;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>_&>
  pPVar12;
  runtime_error *this_00;
  _Rb_tree_color _Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  IdProcess IVar14;
  _Rb_tree_header *p_Var15;
  ExprPtr EVar16;
  initializer_list<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  __l;
  RetType_conflict5 subMap;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_4e8;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_4b8;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_488;
  impl *local_468;
  ExprPtr *local_460;
  _Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  long local_418;
  pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_408;
  AsPointer<mathiu::impl::Set> *local_3e8;
  undefined1 auStack_3e0 [8];
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  _Stack_3d8;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_390;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  *local_380;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_378;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  AsPointer<mathiu::impl::Pair> *local_328;
  anon_class_1_0_00000001 *paStack_320;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  local_318;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_2e0;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  *local_2d0;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  local_2c0;
  undefined1 local_290;
  AsPointer<mathiu::impl::Pair> *local_288;
  anon_class_1_0_00000001 *paStack_280;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  local_278;
  anon_class_1_0_00000001 *local_240;
  InternalPatternT<bool> IStack_238;
  undefined7 uStack_237;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  local_230;
  App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>
  local_1f8;
  AsPointer<mathiu::impl::Set> *local_198;
  _Variadic_union<mathiu::impl::Set_*,_const_mathiu::impl::Set_*> _Stack_190;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_188;
  anon_class_1_0_00000001 *local_140;
  InternalPatternT<bool> IStack_138;
  undefined7 uStack_137;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_130;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_e8;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_78;
  undefined1 local_38;
  
  local_3e8 = (AsPointer<mathiu::impl::Set> *)((ulong)local_3e8 & 0xffffffff00000000);
  auStack_3e0 = (undefined1  [8])0x0;
  _Stack_3d8._M_u._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>_*>)0x0;
  _Stack_3d8._M_u._8_8_ = 0;
  _Stack_3d8._M_u._16_8_ = 0;
  _Stack_3d8._M_u._24_8_ = 0;
  _Stack_3d8._M_u._32_8_ = 0;
  _Stack_3d8._M_u._40_8_ = 0;
  local_78._0_4_ = 0;
  local_78._M_first._M_storage._M_storage[0x38] = '\0';
  local_38 = 0;
  local_460 = ex;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                       *)auStack_3e0);
  local_3e8 = (AsPointer<mathiu::impl::Set> *)((ulong)local_3e8 & 0xffffffff00000000);
  auStack_3e0 = (undefined1  [8])0x0;
  _Stack_3d8._M_u._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>_*>)0x0;
  _Stack_3d8._M_u._8_8_ = 0;
  _Stack_3d8._M_u._16_8_ = 0;
  _Stack_3d8._M_u._24_8_ = 0;
  local_2c0._0_4_ = 0;
  local_2c0._M_first._M_storage._M_storage[0x28] = '\0';
  local_290 = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>
                       *)auStack_3e0);
  peVar1 = (srcDstPairs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&local_130,(Id<mathiu::impl::Set> *)&local_78._M_first);
  local_468 = this;
  matchit::impl::as<mathiu::impl::Set>::{lambda(auto:1)#1}::operator()
            (&local_e8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Set>,
             (Id<mathiu::impl::Set> *)&local_130);
  local_198 = local_e8.mUnary;
  _Stack_190 = (_Variadic_union<mathiu::impl::Set_*,_const_mathiu::impl::Set_*>)
               local_e8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
               ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&local_188,
             (InternalPatternT<matchit::impl::Id<mathiu::impl::Set>_> *)
             ((long)&local_e8.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
             + 8));
  local_140 = local_e8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_138 = local_e8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_137 = local_e8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_3e8 = local_198;
  auStack_3e0 = (undefined1  [8])_Stack_190;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&_Stack_3d8,(Id<mathiu::impl::Set> *)&local_188);
  local_390.mUnary = local_140;
  local_390.mPattern = IStack_138;
  local_390._9_7_ = uStack_137;
  local_380 = &local_78;
  matchit::impl::Id<mathiu::impl::Pair>::Id
            ((Id<mathiu::impl::Pair> *)&local_230,(Id<mathiu::impl::Pair> *)&local_2c0._M_first);
  matchit::impl::as<mathiu::impl::Pair>::{lambda(auto:1)#1}::operator()
            (&local_1f8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Pair>,
             (Id<mathiu::impl::Pair> *)&local_230);
  local_288 = local_1f8.mUnary;
  paStack_280 = local_1f8.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
                ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Pair>::Id
            ((Id<mathiu::impl::Pair> *)&local_278,
             (InternalPatternT<matchit::impl::Id<mathiu::impl::Pair>_> *)
             ((long)&local_1f8.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
             + 8));
  local_240 = local_1f8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_238 = local_1f8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_237 = local_1f8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_328 = local_288;
  paStack_320 = paStack_280;
  matchit::impl::Id<mathiu::impl::Pair>::Id
            ((Id<mathiu::impl::Pair> *)&local_318,(Id<mathiu::impl::Pair> *)&local_278);
  local_2e0.mUnary = local_240;
  local_2e0.mPattern = IStack_238;
  local_2e0._9_7_ = uStack_237;
  local_4e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4e8._M_impl.super__Rb_tree_header._M_header;
  local_4e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4e8._M_impl._0_8_ = 0;
  local_4e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4e8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_4e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_428 = 0;
  uStack_420 = 0;
  local_438 = 0;
  uStack_430 = 0;
  local_448 = 0;
  uStack_440 = 0;
  local_458 = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
               )0x0;
  uStack_450 = 0;
  lVar5 = 8;
  do {
    *(undefined1 *)((long)&local_458 + lVar5) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x48);
  local_418 = 0;
  local_4b8._M_impl._0_8_ = (element_type *)0x0;
  if (*(__index_type *)
       ((long)&(peVar1->super_ExprVariant).
               super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
       + 0x38) == '\r') {
    local_4b8._M_impl._0_8_ = peVar1;
  }
  local_4e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4e8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2d0 = &local_2c0;
  std::variant<std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool>::operator=
            ((variant<std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool> *)
             &local_458,(Set **)&local_4b8);
  lVar5 = local_418 * 2;
  local_418 = local_418 + 1;
  value = std::get<1ul,std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool>
                    ((variant<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
                      *)(&local_458 + lVar5));
  bVar4 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Set_const*&,matchit::impl::Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool>>
                    (value,&local_390,2,
                     (Context<const_mathiu::impl::Set_*,_bool,_const_mathiu::impl::Pair_*,_bool> *)
                     &local_458);
  if (bVar4) {
    bVar4 = matchit::impl::Id<mathiu::impl::Set>::matchValue<mathiu::impl::Set_const&>
                      ((Id<mathiu::impl::Set> *)&_Stack_3d8,*value);
    IVar14 = (IdProcess)bVar4;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
              ((Id<mathiu::impl::Set> *)&_Stack_3d8,3,IVar14);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
              ((Id<mathiu::impl::Set> *)&_Stack_3d8,2,(uint)bVar4);
  }
  else {
    IVar14 = kCANCEL;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
            ((Id<mathiu::impl::Set> *)&_Stack_3d8,1,IVar14);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
            ((Id<mathiu::impl::Set> *)&_Stack_3d8,0,IVar14);
  if (IVar14 == kCANCEL) {
    local_428 = 0;
    uStack_420 = 0;
    local_438 = 0;
    uStack_430 = 0;
    local_448 = 0;
    uStack_440 = 0;
    local_458 = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
                 )0x0;
    uStack_450 = 0;
    lVar5 = 8;
    do {
      *(undefined1 *)((long)&local_458 + lVar5) = 0;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x48);
    local_418 = 0;
    local_4b8._M_impl._0_8_ = (element_type *)0x0;
    if (*(__index_type *)
         ((long)&(peVar1->super_ExprVariant).
                 super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
         + 0x38) == '\x11') {
      local_4b8._M_impl._0_8_ = peVar1;
    }
    std::variant<std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool>::operator=
              ((variant<std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool> *)
               &local_458,(Pair **)&local_4b8);
    lVar5 = local_418 * 2;
    local_418 = local_418 + 1;
    value_00 = std::get<2ul,std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool>
                         ((variant<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
                           *)(&local_458 + lVar5));
    bVar4 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<mathiu::impl::Pair_const*&,matchit::impl::Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool>>
                      (value_00,&local_2e0,2,
                       (Context<const_mathiu::impl::Set_*,_bool,_const_mathiu::impl::Pair_*,_bool> *
                       )&local_458);
    if (bVar4) {
      bVar4 = matchit::impl::Id<mathiu::impl::Pair>::matchValue<mathiu::impl::Pair_const&>
                        ((Id<mathiu::impl::Pair> *)&local_318,*value_00);
      IVar14 = (IdProcess)bVar4;
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
                ((Id<mathiu::impl::Pair> *)&local_318,3,IVar14);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
                ((Id<mathiu::impl::Pair> *)&local_318,2,(uint)bVar4);
    }
    else {
      IVar14 = kCANCEL;
    }
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
              ((Id<mathiu::impl::Pair> *)&local_318,1,IVar14);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
              ((Id<mathiu::impl::Pair> *)&local_318,0,IVar14);
    if (IVar14 == kCANCEL) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Mismatch in substitute!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pIVar11 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>&)_1_,matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,matchit::impl::IdBlock<mathiu::impl::Pair>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_4b8,
                         (variant<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                          *)&local_2d0->_M_first);
    __a = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Pair,mathiu::impl::Pair*,mathiu::impl::Pair_const*>const&>
                    ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                      *)&local_4b8,&(pIVar11->super_IdBlockBase<mathiu::impl::Pair>).mVariant);
    pIVar11 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>&)_1_,matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,matchit::impl::IdBlock<mathiu::impl::Pair>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_4b8,
                         (variant<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                          *)&local_2d0->_M_first);
    pPVar12 = std::
              visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Pair,mathiu::impl::Pair*,mathiu::impl::Pair_const*>const&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                          *)&local_4b8,&(pIVar11->super_IdBlockBase<mathiu::impl::Pair>).mVariant);
    std::
    pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::
    pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_true>
              ((pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                *)&local_488,(shared_ptr<const_mathiu::impl::Expr> *)__a,
               &(pPVar12->super_ExprPtrPair).second);
    __l._M_len = 1;
    __l._M_array = (pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                    *)&local_488;
    std::
    map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::map((map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
           *)&local_4b8,__l,(ExprPtrLess *)&local_408,(allocator_type *)&local_348);
    if (local_488.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_488.second.
                 super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_488.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_488.first.
                 super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::clear(&local_4e8);
    if (local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var15 = &local_4b8._M_impl.super__Rb_tree_header;
      local_4e8._M_impl.super__Rb_tree_header._M_header._M_color =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_color;
      local_4e8._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_4e8._M_impl.super__Rb_tree_header._M_header._M_left =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_4e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &local_4e8._M_impl.super__Rb_tree_header._M_header;
      local_4e8._M_impl.super__Rb_tree_header._M_node_count =
           local_4b8._M_impl.super__Rb_tree_header._M_node_count;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var15->_M_header;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var15->_M_header;
    }
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::~_Rb_tree(&local_4b8);
  }
  else {
    local_4b8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_4b8._M_impl.super__Rb_tree_header._M_header;
    local_4b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_4b8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
    pIVar6 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>&)_1_,matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Set>,matchit::impl::IdBlock<mathiu::impl::Set>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                         *)&local_488,
                        (variant<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                         *)&local_380->_M_first);
    pSVar7 = std::
             visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Set,mathiu::impl::Set*,mathiu::impl::Set_const*>const&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                         *)&local_488,&(pIVar6->super_IdBlockBase<mathiu::impl::Set>).mVariant);
    p_Var10 = (pSVar7->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pIVar6 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>&)_1_,matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Set>,matchit::impl::IdBlock<mathiu::impl::Set>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                         *)&local_488,
                        (variant<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                         *)&local_380->_M_first);
    pSVar7 = std::
             visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Set,mathiu::impl::Set*,mathiu::impl::Set_const*>const&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                         *)&local_488,&(pIVar6->super_IdBlockBase<mathiu::impl::Set>).mVariant);
    p_Var15 = &(pSVar7->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var15) {
      __position._M_node = &local_4b8._M_impl.super__Rb_tree_header._M_header;
      do {
        ppVar8 = &std::
                  get<17ul,int,mathiu::impl::Fraction,mathiu::impl::Symbol,mathiu::impl::Pi,mathiu::impl::E,mathiu::impl::I,mathiu::impl::Infinity,mathiu::impl::Sum,mathiu::impl::Product,mathiu::impl::Power,mathiu::impl::Log,mathiu::impl::Sin,mathiu::impl::Arctan,mathiu::impl::Set,mathiu::impl::List,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,mathiu::impl::PieceWise,mathiu::impl::Pair,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,mathiu::impl::True,mathiu::impl::False,mathiu::impl::Logical,mathiu::impl::SetOp>
                            (*(variant<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                               **)(p_Var10 + 1))->super_ExprPtrPair;
        std::
        pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
        ::pair(&local_488,ppVar8);
        local_408.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_488.first.
                 super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_408.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_488.first.
             super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        local_348 = 0;
        uStack_340 = 0;
        local_408.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_488.second.
                 super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_408.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_488.second.
             super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        local_338 = 0;
        uStack_330 = 0;
        local_488.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_4b8;
        iVar9 = std::
                _Rb_tree<std::shared_ptr<mathiu::impl::Expr_const>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>,std::_Select1st<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                ::
                _M_insert_unique_<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>,std::_Rb_tree<std::shared_ptr<mathiu::impl::Expr_const>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>,std::_Select1st<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>::_Alloc_node>
                          ((_Rb_tree<std::shared_ptr<mathiu::impl::Expr_const>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>,std::_Select1st<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                            *)&local_4b8,__position,&local_408,(_Alloc_node *)&local_488);
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar9._M_node);
        if (local_408.second.
            super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_408.second.
                     super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_408.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_408.first.
                     super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var15);
    }
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::clear(&local_4e8);
    if (local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      local_4e8._M_impl.super__Rb_tree_header._M_header._M_color =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_color;
      local_4e8._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_4e8._M_impl.super__Rb_tree_header._M_header._M_left =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_4e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &local_4e8._M_impl.super__Rb_tree_header._M_header;
      local_4e8._M_impl.super__Rb_tree_header._M_node_count =
           local_4b8._M_impl.super__Rb_tree_header._M_node_count;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_4b8._M_impl.super__Rb_tree_header._M_header;
      local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_4b8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::~_Rb_tree(&local_4b8);
  }
  local_378._M_impl.super__Rb_tree_header._M_header._M_parent =
       local_4e8._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var15 = &local_4e8._M_impl.super__Rb_tree_header;
  local_378._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_378._M_impl.super__Rb_tree_header._M_header;
  if (local_4e8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    _Var13 = _S_red;
    p_Var2 = &local_378;
    local_378._M_impl.super__Rb_tree_header._M_header._M_right =
         local_378._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    (local_4e8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         local_378._M_impl.super__Rb_tree_header._M_header._M_left;
    local_378._M_impl.super__Rb_tree_header._M_node_count =
         local_4e8._M_impl.super__Rb_tree_header._M_node_count;
    local_4e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var2 = &local_4e8;
    local_378._M_impl.super__Rb_tree_header._M_header._M_left =
         local_4e8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_378._M_impl.super__Rb_tree_header._M_header._M_right =
         local_4e8._M_impl.super__Rb_tree_header._M_header._M_right;
    _Var13 = local_4e8._M_impl.super__Rb_tree_header._M_header._M_color;
    local_4e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var15->_M_header;
    local_4e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var15->_M_header;
  }
  (p_Var2->_M_impl).super__Rb_tree_header._M_node_count = 0;
  local_378._M_impl.super__Rb_tree_header._M_header._M_color = _Var13;
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~_Rb_tree(&local_4e8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  ::~_Variant_storage(&local_318);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  ::~_Variant_storage(&local_278);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                       *)((long)&local_1f8.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  ::~_Variant_storage(&local_230);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage(&_Stack_3d8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage(&local_188);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                       *)((long)&local_e8.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage(&local_130);
  piVar3 = local_468;
  substituteImpl(local_468,local_460,(ExprPtrMap *)&local_378);
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~_Rb_tree(&local_378);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                       *)&local_2c0._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                       *)&local_78._M_first);
  EVar16.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  EVar16.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)piVar3;
  return (ExprPtr)EVar16.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr substitute(ExprPtr const &ex, ExprPtr const &srcDstPairs)
    {
#if VERBOSE_DEBUG
        std::cout << "substitute: " << toString(ex) << " " << toString(srcDstPairs) << std::endl;
#endif // VERBOSE_DEBUG
        Id<Set> iSet;
        Id<Pair> iPair;
        auto const subMap = match(*srcDstPairs)(
            pattern | as<Set>(iSet) = [&]
            {
                ExprPtrMap result;
                std::transform((*iSet).begin(), (*iSet).end(), std::inserter(result, result.end()), [&](auto &&e)
                               {
                                   auto pair = std::get<Pair>(*e);
                                   return pair;
                               });
                return result;
            },
            pattern | as<Pair>(iPair) = [&]
            { return ExprPtrMap{{{(*iPair).first, (*iPair).second}}}; },
            pattern | _ = [&]
            {
                throw std::runtime_error("Mismatch in substitute!");
                return ExprPtrMap{};
            });
        return substituteImpl(ex, subMap);
    }